

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

RepeatedField<float> *
google::protobuf::Arena::CreateMessageInternal<google::protobuf::RepeatedField<float>>(Arena *arena)

{
  RepeatedField<float> *pRVar1;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar2;
  
  if (arena == (Arena *)0x0) {
    pRVar1 = (RepeatedField<float> *)operator_new(0x10);
    pRVar1->current_size_ = 0;
    pRVar1->total_size_ = 0;
    pRVar1->arena_or_elements_ = (void *)0x0;
    return pRVar1;
  }
  pVar2 = AllocateAlignedWithCleanup(arena,0x10,(type_info *)&RepeatedField<float>::typeinfo);
  pRVar1 = (RepeatedField<float> *)pVar2.first;
  (pVar2.second)->elem = pRVar1;
  (pVar2.second)->cleanup = internal::arena_destruct_object<google::protobuf::RepeatedField<float>>;
  pRVar1->current_size_ = 0;
  pRVar1->total_size_ = 0;
  pRVar1->arena_or_elements_ = arena;
  return pRVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }